

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

int64_t av1_estimate_txfm_yrd
                  (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int64_t ref_best_rd,BLOCK_SIZE bs,
                  TX_SIZE tx_size)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  SCAN_ORDER *out_dist;
  MACROBLOCK *pMVar8;
  long lVar9;
  MACROBLOCK *in_RCX;
  int *in_RDX;
  TxfmParam *in_RSI;
  undefined8 in_RDI;
  int in_R8D;
  BLOCK_SIZE in_R9B;
  int64_t temp_skip_txfm_rd;
  int64_t rd;
  int64_t skip_rd;
  int64_t no_skip_txfm_rd;
  SCAN_ORDER *scan_order;
  QUANT_PARAM quant_param;
  TxfmParam txfm_param;
  TXB_CTX txb_ctx;
  ENTROPY_CONTEXT *l;
  ENTROPY_CONTEXT *a;
  RD_STATS this_rd_stats;
  int blk_col;
  int blk_row;
  int i;
  rdcost_block_args args;
  int max_blocks_high;
  int max_blocks_wide;
  int step;
  uint8_t txh_unit;
  uint8_t txw_unit;
  int64_t no_this_rd;
  int64_t skip_txfm_rd;
  int skip_txfm_rate;
  int no_skip_txfm_rate;
  int skip_ctx;
  int ctx;
  int tx_size_rate;
  int tx_select;
  int is_inter;
  ModeCosts *mode_costs;
  TxfmSearchParams *txfm_params;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  RD_STATS *in_stack_fffffffffffffdc8;
  MB_MODE_INFO *in_stack_fffffffffffffdd0;
  undefined6 in_stack_fffffffffffffdd8;
  TX_SIZE in_stack_fffffffffffffdde;
  BLOCK_SIZE in_stack_fffffffffffffddf;
  MACROBLOCK *in_stack_fffffffffffffde0;
  undefined2 uVar10;
  int in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdec;
  MACROBLOCK *x_00;
  int in_stack_fffffffffffffdf8;
  undefined7 in_stack_fffffffffffffe18;
  undefined1 uVar11;
  TxfmParam *in_stack_fffffffffffffe20;
  undefined8 in_stack_fffffffffffffe28;
  MACROBLOCK *in_stack_fffffffffffffe30;
  int64_t *in_stack_fffffffffffffe48;
  undefined1 local_160 [24];
  undefined1 local_148 [112];
  RD_STATS RStack_d8;
  MACROBLOCK *local_b0;
  MACROBLOCK *local_a8;
  int local_a0;
  int local_9c;
  int local_90;
  int local_8c;
  int local_88;
  byte local_82;
  byte local_81;
  MACROBLOCK *local_80;
  MACROBLOCK *local_78;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  uint local_58;
  int local_54;
  TxfmParam *local_50;
  int *local_48;
  BLOCK_SIZE *local_40;
  MACROBLOCKD *local_38;
  BLOCK_SIZE local_2a;
  BLOCK_SIZE local_29;
  MACROBLOCK *local_28;
  int *local_20;
  TxfmParam *local_18;
  int32_t local_10 [2];
  long local_8;
  
  local_29 = (BLOCK_SIZE)in_R8D;
  local_38 = (MACROBLOCKD *)&in_RSI[0x11].bd;
  local_40 = (BLOCK_SIZE *)**(undefined8 **)(in_RSI + 0x159);
  local_48 = &in_RSI[0x1893].lossless;
  local_50 = in_RSI + 0x2c2;
  local_2a = in_R9B;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = (int32_t  [2])in_RDI;
  local_54 = is_inter_block(in_stack_fffffffffffffdd0);
  uVar11 = false;
  if (*(char *)(local_48 + 9) == '\x02') {
    iVar7 = block_signals_txsize(*local_40);
    uVar11 = iVar7 != 0;
  }
  local_58 = (uint)(byte)uVar11;
  local_5c = 0;
  if (local_58 != 0) {
    local_60 = txfm_partition_context
                         ((TXFM_CONTEXT *)
                          CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                          (TXFM_CONTEXT *)in_stack_fffffffffffffde0,in_stack_fffffffffffffddf,
                          in_stack_fffffffffffffdde);
    local_5c = *(int *)(&local_50[0x323].tx_set_type + (long)local_60 * 8);
  }
  local_64 = av1_get_skip_txfm_context(local_38);
  local_68 = *(int *)(&local_50[0x318].tx_set_type + (long)local_64 * 8);
  local_6c = (&local_50[0x318].eob)[(long)local_64 * 2];
  iVar7._0_1_ = local_18[0x2c1].tx_type;
  iVar7._1_1_ = local_18[0x2c1].tx_size;
  iVar7._2_2_ = *(undefined2 *)&local_18[0x2c1].field_0x2;
  local_78 = (MACROBLOCK *)((long)local_6c * (long)iVar7 + 0x100 >> 9);
  iVar1._0_1_ = local_18[0x2c1].tx_type;
  iVar1._1_1_ = local_18[0x2c1].tx_size;
  iVar1._2_2_ = *(undefined2 *)&local_18[0x2c1].field_0x2;
  local_80 = (MACROBLOCK *)((long)(local_68 + local_5c) * (long)iVar1 + 0x100 >> 9);
  local_40[0x91] = local_2a;
  local_81 = (byte)tx_size_wide_unit[local_2a];
  local_82 = (byte)tx_size_high_unit[local_2a];
  local_88 = (tx_size_wide_unit[local_2a] & 0xffU) * (tx_size_high_unit[local_2a] & 0xffU);
  local_8c = max_block_wide(local_38,local_29,0);
  local_90 = max_block_high(local_38,local_29,0);
  memset(local_148 + 0x20,0,0x98);
  local_148._40_8_ = local_18;
  local_148._32_4_ = local_10[0];
  local_148._36_4_ = local_10[1];
  local_a8 = local_28;
  x_00 = local_78;
  if ((long)local_80 < (long)local_78) {
    x_00 = local_80;
  }
  local_b0 = x_00;
  av1_init_rd_stats(&RStack_d8);
  av1_get_entropy_contexts
            ((BLOCK_SIZE)((ulong)in_stack_fffffffffffffde0 >> 0x38),
             (macroblockd_plane *)
             CONCAT17(in_stack_fffffffffffffddf,
                      CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
             (ENTROPY_CONTEXT *)in_stack_fffffffffffffdd0,
             (ENTROPY_CONTEXT *)in_stack_fffffffffffffdc8);
  local_148._28_4_ = 0;
  local_148._24_4_ = 0;
  do {
    uVar6 = in_stack_fffffffffffffdec & 0xffffff;
    if ((int)local_148._24_4_ < local_90) {
      uVar6 = CONCAT13(local_9c != 0,(int3)in_stack_fffffffffffffdec) ^ 0xff000000;
    }
    in_stack_fffffffffffffdec = uVar6;
    if ((in_stack_fffffffffffffdec & 0x1000000) == 0) {
      if (local_9c != 0) {
        av1_invalid_rd_stats(&RStack_d8);
      }
      memcpy(local_20,&RStack_d8,0x28);
      if (*local_20 == 0x7fffffff) {
        local_8 = 0x7fffffffffffffff;
      }
      else {
        if (((char)local_20[8] == '\0') || (local_54 == 0)) {
          iVar4._0_1_ = local_18[0x2c1].tx_type;
          iVar4._1_1_ = local_18[0x2c1].tx_size;
          iVar4._2_2_ = *(undefined2 *)&local_18[0x2c1].field_0x2;
          local_8 = ((long)(*local_20 + local_68 + local_5c) * (long)iVar4 + 0x100 >> 9) +
                    *(long *)(local_20 + 2) * 0x80;
          *local_20 = local_5c + *local_20;
        }
        else {
          iVar3._0_1_ = local_18[0x2c1].tx_type;
          iVar3._1_1_ = local_18[0x2c1].tx_size;
          iVar3._2_2_ = *(undefined2 *)&local_18[0x2c1].field_0x2;
          local_8 = ((long)local_6c * (long)iVar3 + 0x100 >> 9) + *(long *)(local_20 + 6) * 0x80;
        }
        if ((((local_54 != 0) && ((char)local_20[8] == '\0')) &&
            (local_38->lossless[(byte)*(undefined2 *)(local_40 + 0xa7) & 7] == 0)) &&
           (iVar5._0_1_ = local_18[0x2c1].tx_type, iVar5._1_1_ = local_18[0x2c1].tx_size,
           iVar5._2_2_ = *(undefined2 *)&local_18[0x2c1].field_0x2,
           lVar9 = ((long)local_6c * (long)iVar5 + 0x100 >> 9) + *(long *)(local_20 + 6) * 0x80,
           lVar9 <= local_8)) {
          *local_20 = 0;
          *(undefined8 *)(local_20 + 2) = *(undefined8 *)(local_20 + 6);
          *(undefined1 *)(local_20 + 8) = 1;
          local_8 = lVar9;
        }
      }
      return local_8;
    }
    for (local_148._20_4_ = 0; (int)local_148._20_4_ < local_8c;
        local_148._20_4_ = (uint)local_81 + local_148._20_4_) {
      av1_init_rd_stats((RD_STATS *)local_160);
      if (local_a0 != 0) {
        local_9c = 1;
        break;
      }
      get_txb_ctx((BLOCK_SIZE)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                  (TX_SIZE)((ulong)in_stack_fffffffffffffde0 >> 0x30),(int)in_stack_fffffffffffffde0
                  ,(ENTROPY_CONTEXT *)
                   CONCAT17(in_stack_fffffffffffffddf,
                            CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                  (ENTROPY_CONTEXT *)in_stack_fffffffffffffdd0,(TXB_CTX *)in_stack_fffffffffffffdc8)
      ;
      uVar10 = (undefined2)((ulong)in_stack_fffffffffffffde0 >> 0x30);
      av1_setup_xform((AV1_COMMON *)x_00,
                      (MACROBLOCK *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                      (TX_SIZE)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                      (TX_TYPE)((ulong)in_stack_fffffffffffffde0 >> 0x30),
                      (TxfmParam *)
                      CONCAT17(in_stack_fffffffffffffddf,
                               CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)));
      av1_setup_quant((TX_SIZE)((ulong)in_stack_fffffffffffffdd0 >> 0x38),
                      (int)in_stack_fffffffffffffdd0,(int)((ulong)in_stack_fffffffffffffdc8 >> 0x20)
                      ,(int)in_stack_fffffffffffffdc8,(QUANT_PARAM *)0x335c3b);
      av1_xform(in_RCX,in_R8D,in_stack_fffffffffffffdf8,(int)((ulong)x_00 >> 0x20),(int)x_00,
                (BLOCK_SIZE)(in_stack_fffffffffffffdec >> 0x18),in_RSI);
      av1_quant(in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                (int)in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
                (QUANT_PARAM *)CONCAT17(uVar11,in_stack_fffffffffffffe18));
      local_160._0_4_ =
           cost_coeffs(x_00,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
                       (TX_SIZE)((ushort)uVar10 >> 8),(TX_TYPE)uVar10,
                       (TXB_CTX *)
                       CONCAT17(in_stack_fffffffffffffddf,
                                CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                       (int)in_RCX);
      out_dist = get_scan('\0','\0');
      in_stack_fffffffffffffdc8 = (RD_STATS *)(local_160 + 8);
      in_stack_fffffffffffffdd0 = (MB_MODE_INFO *)local_148;
      dist_block_tx_domain
                (in_stack_fffffffffffffe30,(int)((ulong)in_stack_fffffffffffffe28 >> 0x20),
                 (int)in_stack_fffffffffffffe28,(TX_SIZE)((ulong)in_stack_fffffffffffffe20 >> 0x38),
                 (qm_val_t *)CONCAT17(uVar11,in_stack_fffffffffffffe18),(int16_t *)in_RSI,
                 (int64_t *)out_dist,in_stack_fffffffffffffe48);
      iVar2._0_1_ = local_18[0x2c1].tx_type;
      iVar2._1_1_ = local_18[0x2c1].tx_size;
      iVar2._2_2_ = *(undefined2 *)&local_18[0x2c1].field_0x2;
      pMVar8 = (MACROBLOCK *)
               (((long)(int)local_160._0_4_ * (long)iVar2 + 0x100 >> 9) + local_160._8_8_ * 0x80);
      in_stack_fffffffffffffe30 = (MACROBLOCK *)(local_148._0_8_ * 0x80);
      local_148[8] = local_148[8] &
                     (*(short *)(*(long *)&local_18[1].bd + (long)(int)local_148._28_4_ * 2) != 0 ^
                     0xffU) & 1;
      av1_merge_rd_stats((RD_STATS *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      in_stack_fffffffffffffde0 = in_stack_fffffffffffffe30;
      if ((long)pMVar8 < (long)in_stack_fffffffffffffe30) {
        in_stack_fffffffffffffde0 = pMVar8;
      }
      local_b0 = (MACROBLOCK *)
                 ((long)&in_stack_fffffffffffffde0->plane[0].src_diff +
                 (long)&local_b0->plane[0].src_diff);
      if ((long)local_28 < (long)local_b0) {
        local_a0 = 1;
        break;
      }
      av1_set_txb_context(x_00,in_stack_fffffffffffffdec,in_stack_fffffffffffffde8,
                          (TX_SIZE)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                          (ENTROPY_CONTEXT *)
                          CONCAT17(in_stack_fffffffffffffddf,
                                   CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                          (ENTROPY_CONTEXT *)in_stack_fffffffffffffdd0);
      local_148._28_4_ = local_88 + local_148._28_4_;
    }
    local_148._24_4_ = (uint)local_82 + local_148._24_4_;
  } while( true );
}

Assistant:

int64_t av1_estimate_txfm_yrd(const AV1_COMP *const cpi, MACROBLOCK *x,
                              RD_STATS *rd_stats, int64_t ref_best_rd,
                              BLOCK_SIZE bs, TX_SIZE tx_size) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  const ModeCosts *mode_costs = &x->mode_costs;
  const int is_inter = is_inter_block(mbmi);
  const int tx_select = txfm_params->tx_mode_search_type == TX_MODE_SELECT &&
                        block_signals_txsize(mbmi->bsize);
  int tx_size_rate = 0;
  if (tx_select) {
    const int ctx = txfm_partition_context(
        xd->above_txfm_context, xd->left_txfm_context, mbmi->bsize, tx_size);
    tx_size_rate = mode_costs->txfm_partition_cost[ctx][0];
  }
  const int skip_ctx = av1_get_skip_txfm_context(xd);
  const int no_skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][0];
  const int skip_txfm_rate = mode_costs->skip_txfm_cost[skip_ctx][1];
  const int64_t skip_txfm_rd = RDCOST(x->rdmult, skip_txfm_rate, 0);
  const int64_t no_this_rd =
      RDCOST(x->rdmult, no_skip_txfm_rate + tx_size_rate, 0);
  mbmi->tx_size = tx_size;

  const uint8_t txw_unit = tx_size_wide_unit[tx_size];
  const uint8_t txh_unit = tx_size_high_unit[tx_size];
  const int step = txw_unit * txh_unit;
  const int max_blocks_wide = max_block_wide(xd, bs, 0);
  const int max_blocks_high = max_block_high(xd, bs, 0);

  struct rdcost_block_args args;
  av1_zero(args);
  args.x = x;
  args.cpi = cpi;
  args.best_rd = ref_best_rd;
  args.current_rd = AOMMIN(no_this_rd, skip_txfm_rd);
  av1_init_rd_stats(&args.rd_stats);
  av1_get_entropy_contexts(bs, &xd->plane[0], args.t_above, args.t_left);
  int i = 0;
  for (int blk_row = 0; blk_row < max_blocks_high && !args.incomplete_exit;
       blk_row += txh_unit) {
    for (int blk_col = 0; blk_col < max_blocks_wide; blk_col += txw_unit) {
      RD_STATS this_rd_stats;
      av1_init_rd_stats(&this_rd_stats);

      if (args.exit_early) {
        args.incomplete_exit = 1;
        break;
      }

      ENTROPY_CONTEXT *a = args.t_above + blk_col;
      ENTROPY_CONTEXT *l = args.t_left + blk_row;
      TXB_CTX txb_ctx;
      get_txb_ctx(bs, tx_size, 0, a, l, &txb_ctx);

      TxfmParam txfm_param;
      QUANT_PARAM quant_param;
      av1_setup_xform(&cpi->common, x, tx_size, DCT_DCT, &txfm_param);
      av1_setup_quant(tx_size, 0, AV1_XFORM_QUANT_B, 0, &quant_param);

      av1_xform(x, 0, i, blk_row, blk_col, bs, &txfm_param);
      av1_quant(x, 0, i, &txfm_param, &quant_param);

      this_rd_stats.rate =
          cost_coeffs(x, 0, i, tx_size, txfm_param.tx_type, &txb_ctx, 0);

      const SCAN_ORDER *const scan_order =
          get_scan(txfm_param.tx_size, txfm_param.tx_type);
      dist_block_tx_domain(x, 0, i, tx_size, quant_param.qmatrix,
                           scan_order->scan, &this_rd_stats.dist,
                           &this_rd_stats.sse);

      const int64_t no_skip_txfm_rd =
          RDCOST(x->rdmult, this_rd_stats.rate, this_rd_stats.dist);
      const int64_t skip_rd = RDCOST(x->rdmult, 0, this_rd_stats.sse);

      this_rd_stats.skip_txfm &= !x->plane[0].eobs[i];

      av1_merge_rd_stats(&args.rd_stats, &this_rd_stats);
      args.current_rd += AOMMIN(no_skip_txfm_rd, skip_rd);

      if (args.current_rd > ref_best_rd) {
        args.exit_early = 1;
        break;
      }

      av1_set_txb_context(x, 0, i, tx_size, a, l);
      i += step;
    }
  }

  if (args.incomplete_exit) av1_invalid_rd_stats(&args.rd_stats);

  *rd_stats = args.rd_stats;
  if (rd_stats->rate == INT_MAX) return INT64_MAX;

  int64_t rd;
  // rdstats->rate should include all the rate except skip/non-skip cost as the
  // same is accounted in the caller functions after rd evaluation of all
  // planes. However the decisions should be done after considering the
  // skip/non-skip header cost
  if (rd_stats->skip_txfm && is_inter) {
    rd = RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
  } else {
    // Intra blocks are always signalled as non-skip
    rd = RDCOST(x->rdmult, rd_stats->rate + no_skip_txfm_rate + tx_size_rate,
                rd_stats->dist);
    rd_stats->rate += tx_size_rate;
  }
  // Check if forcing the block to skip transform leads to smaller RD cost.
  if (is_inter && !rd_stats->skip_txfm && !xd->lossless[mbmi->segment_id]) {
    int64_t temp_skip_txfm_rd =
        RDCOST(x->rdmult, skip_txfm_rate, rd_stats->sse);
    if (temp_skip_txfm_rd <= rd) {
      rd = temp_skip_txfm_rd;
      rd_stats->rate = 0;
      rd_stats->dist = rd_stats->sse;
      rd_stats->skip_txfm = 1;
    }
  }

  return rd;
}